

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::Expression::visit<(anonymous_namespace)::HierarchicalVisitor&>
          (Expression *this,HierarchicalVisitor *visitor)

{
  __index_type _Var1;
  SourceLocation this_00;
  pointer ppEVar2;
  size_type sVar3;
  undefined8 *puVar4;
  ConstantValue *pCVar5;
  ExpressionSyntax *pEVar6;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar7;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar8;
  DeclaredType *this_01;
  Expression *pEVar9;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar10;
  logic_error *plVar11;
  long lVar12;
  long lVar13;
  DistItem *item;
  undefined8 *puVar14;
  Condition *cond;
  not_null<const_slang::ast::Expression_*> *pnVar15;
  allocator<char> local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
LAB_00212fe1:
  lVar13 = 0x38;
  switch((((AssignmentPatternExpressionBase *)this)->super_Expression).kind) {
  case Invalid:
  case IntegerLiteral:
  case RealLiteral:
  case TimeLiteral:
  case UnbasedUnsizedIntegerLiteral:
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case NamedValue:
  case MemberAccess:
  case DataType:
  case TypeReference:
  case HierarchicalReference:
  case LValueReference:
  case EmptyArgument:
    break;
  case HierarchicalValue:
    visitor->any = true;
    return;
  case UnaryOp:
  case Conversion:
    goto switchD_00213000_caseD_a;
  case BinaryOp:
    goto switchD_00213000_caseD_b;
  case ConditionalOp:
    pnVar15 = (not_null<const_slang::ast::Expression_*> *)
              (((AssignmentPatternExpressionBase *)this)->elements_).data_;
    for (lVar13 = (((AssignmentPatternExpressionBase *)this)->elements_).size_ << 4; lVar13 != 0;
        lVar13 = lVar13 + -0x10) {
      pEVar9 = not_null<const_slang::ast::Expression_*>::get(pnVar15);
      visit<(anonymous_namespace)::HierarchicalVisitor&>(pEVar9,visitor);
      pnVar15 = pnVar15 + 2;
    }
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              (*(Expression **)
                &((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression,visitor)
    ;
    lVar13 = 0x48;
    goto switchD_00213000_caseD_a;
  case Inside:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              ((Expression *)(((AssignmentPatternExpressionBase *)this)->elements_).data_,visitor);
    sVar3 = (((AssignmentPatternExpressionBase *)this)->elements_).size_;
    lVar13 = *(long *)&((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression;
    for (lVar12 = 0; lVar13 << 3 != lVar12; lVar12 = lVar12 + 8) {
      visit<(anonymous_namespace)::HierarchicalVisitor&>(*(Expression **)(sVar3 + lVar12),visitor);
    }
    break;
  case Assignment:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              (*(Expression **)
                &((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression,visitor)
    ;
    lVar13 = 0x48;
    goto switchD_00213000_caseD_a;
  case Concatenation:
    ppEVar2 = (((AssignmentPatternExpressionBase *)this)->elements_).data_;
    sVar3 = (((AssignmentPatternExpressionBase *)this)->elements_).size_;
    for (lVar13 = 0; sVar3 << 3 != lVar13; lVar13 = lVar13 + 8) {
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)ppEVar2 + lVar13),visitor);
    }
    break;
  case Replication:
  case ElementSelect:
  case OpenRange:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              ((Expression *)(((AssignmentPatternExpressionBase *)this)->elements_).data_,visitor);
    goto switchD_00213000_caseD_a;
  case Streaming:
    pnVar15 = (not_null<const_slang::ast::Expression_*> *)
              (((AssignmentPatternExpressionBase *)this)->elements_).size_;
    for (lVar13 = *(long *)&((AssignmentPatternExpressionBase *)((long)this + 0x40))->
                            super_Expression * 0x18; lVar13 != 0; lVar13 = lVar13 + -0x18) {
      pEVar9 = not_null<const_slang::ast::Expression_*>::get(pnVar15);
      visit<(anonymous_namespace)::HierarchicalVisitor&>(pEVar9,visitor);
      if (pnVar15[1].ptr != (Expression *)0x0) {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(pnVar15[1].ptr,visitor);
      }
      pnVar15 = pnVar15 + 3;
    }
    break;
  case RangeSelect:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              ((Expression *)(((AssignmentPatternExpressionBase *)this)->elements_).data_,visitor);
switchD_00213000_caseD_b:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              ((Expression *)(((AssignmentPatternExpressionBase *)this)->elements_).size_,visitor);
    lVar13 = 0x40;
    goto switchD_00213000_caseD_a;
  case Call:
    this_00 = (((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression).
              sourceRange.endLoc;
    if (this_00 != (SourceLocation)0x0) {
      visit<(anonymous_namespace)::HierarchicalVisitor&>((Expression *)this_00,visitor);
    }
    if (*(char *)&(((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression).
                  sourceRange.startLoc == '\x01') {
      pvVar7 = std::
               get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                         ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                           *)&((AssignmentPatternExpressionBase *)this)->elements_);
      _Var1 = *(__index_type *)
               ((long)&(pvVar7->extraInfo).
                       super__Variant_base<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Move_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                       .
                       super__Variant_storage_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
               + 0x18);
      if (_Var1 == '\x02') {
        pvVar10 = std::
                  get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                            (&pvVar7->extraInfo);
        if ((pvVar10->inlineConstraints != (Constraint *)0x0) &&
           (Foreach < pvVar10->inlineConstraints->kind)) {
          plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                     ,&local_f1);
          std::operator+(&local_b0,&local_d0,":");
          std::__cxx11::to_string(&local_f0,0x181);
          std::operator+(&local_90,&local_b0,&local_f0);
          std::operator+(&local_70,&local_90,": ");
          std::operator+(&local_50,&local_70,"Default case should be unreachable!");
          std::logic_error::logic_error(plVar11,(string *)&local_50);
          __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
      else if (_Var1 == '\x01') {
        pvVar8 = std::
                 get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                           (&pvVar7->extraInfo);
        if (pvVar8->iterExpr != (Expression *)0x0) {
          visit<(anonymous_namespace)::HierarchicalVisitor&>(pvVar8->iterExpr,visitor);
        }
      }
    }
    ppEVar2 = (((AssignmentPatternExpressionBase *)((long)this + 0x40))->elements_).data_;
    sVar3 = (((AssignmentPatternExpressionBase *)((long)this + 0x40))->elements_).size_;
    for (lVar13 = 0; sVar3 << 3 != lVar13; lVar13 = lVar13 + 8) {
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)ppEVar2 + lVar13),visitor);
    }
    break;
  case SimpleAssignmentPattern:
  case StructuredAssignmentPattern:
    goto switchD_00213000_caseD_1b;
  case ReplicatedAssignmentPattern:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              (*(Expression **)
                &((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression,visitor)
    ;
switchD_00213000_caseD_1b:
    AssignmentPatternExpressionBase::visitExprs<(anonymous_namespace)::HierarchicalVisitor&>
              ((AssignmentPatternExpressionBase *)this,visitor);
    return;
  case Dist:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              ((Expression *)(((AssignmentPatternExpressionBase *)this)->elements_).data_,visitor);
    puVar4 = (undefined8 *)(((AssignmentPatternExpressionBase *)this)->elements_).size_;
    lVar13 = *(long *)&((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression;
    puVar14 = puVar4;
    for (lVar12 = 0; lVar13 << 5 != lVar12; lVar12 = lVar12 + 0x20) {
      visit<(anonymous_namespace)::HierarchicalVisitor&>((Expression *)*puVar14,visitor);
      if (*(char *)(puVar14 + 3) == '\x01') {
        visit<(anonymous_namespace)::HierarchicalVisitor&>
                  (*(Expression **)((long)puVar4 + lVar12 + 0x10),visitor);
      }
      puVar14 = puVar14 + 4;
    }
    break;
  case NewArray:
    visit<(anonymous_namespace)::HierarchicalVisitor&>
              ((Expression *)(((AssignmentPatternExpressionBase *)this)->elements_).data_,visitor);
  case NewClass:
  case TaggedUnion:
    goto switchD_00213000_caseD_22;
  case NewCovergroup:
    ppEVar2 = (((AssignmentPatternExpressionBase *)this)->elements_).data_;
    sVar3 = (((AssignmentPatternExpressionBase *)this)->elements_).size_;
    for (lVar13 = 0; sVar3 << 3 != lVar13; lVar13 = lVar13 + 8) {
      visit<(anonymous_namespace)::HierarchicalVisitor&>
                (*(Expression **)((long)ppEVar2 + lVar13),visitor);
    }
    break;
  case CopyClass:
  case MinTypMax:
    lVar13 = 0x30;
switchD_00213000_caseD_a:
    this = *(Expression **)
            ((long)&(((AssignmentPatternExpressionBase *)this)->super_Expression).kind + lVar13);
    goto LAB_00212fe1;
  case ClockingEvent:
    if (*(uint *)(((AssignmentPatternExpressionBase *)this)->elements_).data_ < 10) {
      return;
    }
    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_f1);
    std::operator+(&local_b0,&local_d0,":");
    std::__cxx11::to_string(&local_f0,0x123);
    std::operator+(&local_90,&local_b0,&local_f0);
    std::operator+(&local_70,&local_90,": ");
    std::operator+(&local_50,&local_70,"Default case should be unreachable!");
    std::logic_error::logic_error(plVar11,(string *)&local_50);
    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case AssertionInstance:
    if (0xc < *(uint *)(((AssignmentPatternExpressionBase *)this)->elements_).size_) {
      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,&local_f1);
      std::operator+(&local_b0,&local_d0,":");
      std::__cxx11::to_string(&local_f0,0x199);
      std::operator+(&local_90,&local_b0,&local_f0);
      std::operator+(&local_70,&local_90,": ");
      std::operator+(&local_50,&local_70,"Default case should be unreachable!");
      std::logic_error::logic_error(plVar11,(string *)&local_50);
      __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pCVar5 = (((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression).constant;
    pEVar6 = (((AssignmentPatternExpressionBase *)((long)this + 0x40))->super_Expression).syntax;
    for (lVar13 = 0; (long)pEVar6 << 3 != lVar13; lVar13 = lVar13 + 8) {
      this_01 = Symbol::getDeclaredType
                          (*(Symbol **)
                            ((long)&(pCVar5->value).
                                    super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            + lVar13));
      if (this_01 == (DeclaredType *)0x0) {
        assert::assertFailed
                  ("dt",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/expressions/MiscExpressions.h"
                   ,0xe4,
                   "void slang::ast::AssertionInstanceExpression::visitExprs(TVisitor &&) const [TVisitor = (anonymous namespace)::HierarchicalVisitor &]"
                  );
      }
      pEVar9 = DeclaredType::getInitializer(this_01);
      if (pEVar9 != (Expression *)0x0) {
        visit<(anonymous_namespace)::HierarchicalVisitor&>(pEVar9,visitor);
      }
    }
    break;
  default:
    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_f1);
    std::operator+(&local_b0,&local_d0,":");
    std::__cxx11::to_string(&local_f0,0x15b);
    std::operator+(&local_90,&local_b0,&local_f0);
    std::operator+(&local_70,&local_90,": ");
    std::operator+(&local_50,&local_70,"Default case should be unreachable!");
    std::logic_error::logic_error(plVar11,(string *)&local_50);
    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
switchD_00213000_caseD_22:
  this = (Expression *)(((AssignmentPatternExpressionBase *)this)->elements_).size_;
  if ((AssignmentPatternExpressionBase *)this == (AssignmentPatternExpressionBase *)0x0) {
    return;
  }
  goto LAB_00212fe1;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}